

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O3

void __thiscall
Clique::computeIntervalIntersection(Clique *this,uint *interval_start,uint *interval_end)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  alignment_set_t *paVar4;
  undefined4 extraout_var;
  int iVar5;
  ulong uVar6;
  AlignmentRecord *this_00;
  
  paVar4 = this->alignment_set;
  if (paVar4->m_num_bits != 0) {
    iVar5 = 0;
    uVar6 = 0;
    do {
      if (((paVar4->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0) {
        iVar1 = (*this->parent->_vptr_CliqueFinder[5])(this->parent,uVar6);
        this_00 = (AlignmentRecord *)CONCAT44(extraout_var,iVar1);
        if (iVar5 == 0) {
          uVar2 = AlignmentRecord::getIntervalStart(this_00);
          *interval_start = uVar2;
          uVar2 = AlignmentRecord::getIntervalEnd(this_00);
          iVar5 = 1;
        }
        else {
          iVar5 = iVar5 + 1;
          uVar2 = AlignmentRecord::getIntervalStart(this_00);
          if (uVar2 < *interval_start) {
            uVar2 = *interval_start;
          }
          *interval_start = uVar2;
          uVar3 = AlignmentRecord::getIntervalEnd(this_00);
          uVar2 = *interval_end;
          if (uVar3 < *interval_end) {
            uVar2 = uVar3;
          }
        }
        *interval_end = uVar2;
      }
      uVar6 = uVar6 + 1;
      paVar4 = this->alignment_set;
    } while (uVar6 < paVar4->m_num_bits);
  }
  return;
}

Assistant:

void Clique::computeIntervalIntersection(unsigned int* interval_start, unsigned int* interval_end) {
	int n = 0;
	// for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
	for (size_t i=0; i<alignment_set->size(); ++i) {
		if (!alignment_set->test(i)) continue;
		const AlignmentRecord& ap = parent.getAlignmentByIndex(i);
		if (n++==0) {
			*interval_start = ap.getIntervalStart();
			*interval_end = ap.getIntervalEnd();
		} else {
			*interval_start = max(*interval_start,ap.getIntervalStart());
			*interval_end = min(*interval_end,ap.getIntervalEnd());
		}
	}
}